

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ref_geom.c
# Opt level: O0

REF_STATUS ref_geom_remove_without_cell(REF_GRID ref_grid,REF_INT node)

{
  int geom_00;
  int iVar1;
  REF_GEOM ref_geom_00;
  REF_ADJ pRVar2;
  bool bVar3;
  uint uVar4;
  bool bVar5;
  REF_INT local_78;
  int local_74;
  REF_INT local_6c;
  int local_68;
  REF_INT local_5c;
  REF_STATUS ref_private_macro_code_rss_2;
  REF_STATUS ref_private_macro_code_rss_1;
  REF_STATUS ref_private_macro_code_rss;
  REF_BOOL supported_by_cell;
  REF_INT group;
  REF_INT geom;
  REF_INT item;
  REF_INT type;
  REF_CELL ref_cell;
  REF_ADJ ref_adj;
  REF_GEOM ref_geom;
  REF_INT node_local;
  REF_GRID ref_grid_local;
  
  ref_geom_00 = ref_grid->geom;
  pRVar2 = ref_geom_00->ref_adj;
  if ((node < 0) || (pRVar2->nnode <= node)) {
    local_5c = -1;
  }
  else {
    local_5c = pRVar2->first[node];
  }
  group = local_5c;
  while( true ) {
    while( true ) {
      while( true ) {
        if (group == -1) {
          return 0;
        }
        geom_00 = pRVar2->item[group].ref;
        iVar1 = ref_geom_00->descr[geom_00 * 6];
        if (iVar1 != 0) break;
        group = pRVar2->item[group].next;
      }
      if (iVar1 != 1) break;
      bVar5 = false;
      ref_private_macro_code_rss = 0;
      _item = ref_grid->cell[0];
      while (ref_private_macro_code_rss < 3) {
        bVar3 = !bVar5;
        bVar5 = true;
        if (bVar3) {
          if ((node < 0) || (_item->ref_adj->nnode <= node)) {
            local_68 = -1;
          }
          else {
            local_68 = _item->ref_adj->first[node];
          }
          bVar5 = local_68 != -1;
        }
        ref_private_macro_code_rss = ref_private_macro_code_rss + 1;
        _item = ref_grid->cell[ref_private_macro_code_rss];
      }
      if (bVar5) {
        group = pRVar2->item[group].next;
      }
      else {
        uVar4 = ref_geom_remove(ref_geom_00,geom_00);
        if (uVar4 != 0) {
          printf("%s: %d: %s: %d %s\n",
                 "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_geom.c",
                 0x268,"ref_geom_remove_without_cell",(ulong)uVar4,"remove");
          return uVar4;
        }
        if ((node < 0) || (pRVar2->nnode <= node)) {
          local_6c = -1;
        }
        else {
          local_6c = pRVar2->first[node];
        }
        group = local_6c;
      }
    }
    if (iVar1 != 2) break;
    bVar5 = false;
    ref_private_macro_code_rss = 3;
    _item = ref_grid->cell[3];
    while (ref_private_macro_code_rss < 6) {
      bVar3 = !bVar5;
      bVar5 = true;
      if (bVar3) {
        if ((node < 0) || (_item->ref_adj->nnode <= node)) {
          local_74 = -1;
        }
        else {
          local_74 = _item->ref_adj->first[node];
        }
        bVar5 = local_74 != -1;
      }
      ref_private_macro_code_rss = ref_private_macro_code_rss + 1;
      _item = ref_grid->cell[ref_private_macro_code_rss];
    }
    if (bVar5) {
      group = pRVar2->item[group].next;
    }
    else {
      uVar4 = ref_geom_remove(ref_geom_00,geom_00);
      if (uVar4 != 0) {
        printf("%s: %d: %s: %d %s\n",
               "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_geom.c",
               0x275,"ref_geom_remove_without_cell",(ulong)uVar4,"remove");
        return uVar4;
      }
      if ((node < 0) || (pRVar2->nnode <= node)) {
        local_78 = -1;
      }
      else {
        local_78 = pRVar2->first[node];
      }
      group = local_78;
    }
  }
  printf("%s: %d: %s: %d %s\n",
         "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_geom.c",0x27a,
         "ref_geom_remove_without_cell",6,"can\'t to geom type yet");
  return 6;
}

Assistant:

REF_FCN REF_STATUS ref_geom_remove_without_cell(REF_GRID ref_grid,
                                                REF_INT node) {
  REF_GEOM ref_geom = ref_grid_geom(ref_grid);
  REF_ADJ ref_adj = ref_geom_adj(ref_geom);
  REF_CELL ref_cell;
  REF_INT type, item, geom, group;
  REF_BOOL supported_by_cell;

  item = ref_adj_first(ref_adj, node);
  while (ref_adj_valid(item)) {
    geom = ref_adj_item_ref(ref_adj, item);
    type = ref_geom_type(ref_geom, geom);
    switch (type) {
      case REF_GEOM_NODE:
        item = ref_adj_item_next(ref_adj, item);
        break;
      case REF_GEOM_EDGE:
        supported_by_cell = REF_FALSE;
        each_ref_grid_edge_ref_cell(ref_grid, group, ref_cell) {
          supported_by_cell =
              (supported_by_cell || !ref_cell_node_empty(ref_cell, node));
        }
        if (supported_by_cell) {
          item = ref_adj_item_next(ref_adj, item);
        } else {
          RSS(ref_geom_remove(ref_geom, geom), "remove");
          item = ref_adj_first(ref_adj, node);
        }
        break;
      case REF_GEOM_FACE:
        supported_by_cell = REF_FALSE;
        each_ref_grid_face_ref_cell(ref_grid, group, ref_cell) {
          supported_by_cell =
              (supported_by_cell || !ref_cell_node_empty(ref_cell, node));
        }
        if (supported_by_cell) {
          item = ref_adj_item_next(ref_adj, item);
        } else {
          RSS(ref_geom_remove(ref_geom, geom), "remove");
          item = ref_adj_first(ref_adj, node);
        }
        break;
      default:
        RSS(REF_IMPLEMENT, "can't to geom type yet");
    }
  }

  return REF_SUCCESS;
}